

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerHLSL::emit_builtin_inputs_in_struct(CompilerHLSL *this)

{
  size_t count;
  uint *puVar1;
  __node_base *p_Var2;
  long lVar3;
  uint32_t i;
  ulong uVar4;
  long lVar5;
  bool legacy;
  bool local_69;
  SmallVector<unsigned_int,_8UL> local_68;
  anon_class_16_2_1de67c4e local_30;
  
  local_69 = (this->hlsl_options).shader_model < 0x1f;
  local_30.legacy = &local_69;
  local_30.this = this;
  for (uVar4 = 0; uVar4 != 0x40; uVar4 = uVar4 + 1) {
    if (((this->super_CompilerGLSL).super_Compiler.active_input_builtins.lower >> (uVar4 & 0x3f) & 1
        ) != 0) {
      emit_builtin_inputs_in_struct::anon_class_16_2_1de67c4e::operator()(&local_30,(uint32_t)uVar4)
      ;
    }
  }
  count = (this->super_CompilerGLSL).super_Compiler.active_input_builtins.higher._M_h.
          _M_element_count;
  if (count != 0) {
    local_68.super_VectorView<unsigned_int>.ptr = (uint *)&local_68.stack_storage;
    local_68.super_VectorView<unsigned_int>.buffer_size = 0;
    local_68.buffer_capacity = 8;
    SmallVector<unsigned_int,_8UL>::reserve(&local_68,count);
    p_Var2 = &(this->super_CompilerGLSL).super_Compiler.active_input_builtins.higher._M_h.
              _M_before_begin;
    while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
      SmallVector<unsigned_int,_8UL>::push_back(&local_68,(uint *)(p_Var2 + 1));
    }
    ::std::__sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
              (local_68.super_VectorView<unsigned_int>.ptr,
               (char *)local_68.super_VectorView<unsigned_int>.ptr +
               local_68.super_VectorView<unsigned_int>.buffer_size * 4);
    puVar1 = local_68.super_VectorView<unsigned_int>.ptr;
    lVar5 = local_68.super_VectorView<unsigned_int>.buffer_size << 2;
    for (lVar3 = 0; lVar5 != lVar3; lVar3 = lVar3 + 4) {
      emit_builtin_inputs_in_struct::anon_class_16_2_1de67c4e::operator()
                (&local_30,*(uint32_t *)((char *)puVar1 + lVar3));
    }
    SmallVector<unsigned_int,_8UL>::~SmallVector(&local_68);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_builtin_inputs_in_struct()
{
	bool legacy = hlsl_options.shader_model <= 30;
	active_input_builtins.for_each_bit([&](uint32_t i) {
		const char *type = nullptr;
		const char *semantic = nullptr;
		auto builtin = static_cast<BuiltIn>(i);
		switch (builtin)
		{
		case BuiltInFragCoord:
			type = "float4";
			semantic = legacy ? "VPOS" : "SV_Position";
			break;

		case BuiltInVertexId:
		case BuiltInVertexIndex:
			if (legacy)
				SPIRV_CROSS_THROW("Vertex index not supported in SM 3.0 or lower.");
			type = "uint";
			semantic = "SV_VertexID";
			break;

		case BuiltInPrimitiveId:
			type = "uint";
			semantic = "SV_PrimitiveID";
			break;

		case BuiltInInstanceId:
		case BuiltInInstanceIndex:
			if (legacy)
				SPIRV_CROSS_THROW("Instance index not supported in SM 3.0 or lower.");
			type = "uint";
			semantic = "SV_InstanceID";
			break;

		case BuiltInSampleId:
			if (legacy)
				SPIRV_CROSS_THROW("Sample ID not supported in SM 3.0 or lower.");
			type = "uint";
			semantic = "SV_SampleIndex";
			break;

		case BuiltInSampleMask:
			if (hlsl_options.shader_model < 50 || get_entry_point().model != ExecutionModelFragment)
				SPIRV_CROSS_THROW("Sample Mask input is only supported in PS 5.0 or higher.");
			type = "uint";
			semantic = "SV_Coverage";
			break;

		case BuiltInGlobalInvocationId:
			type = "uint3";
			semantic = "SV_DispatchThreadID";
			break;

		case BuiltInLocalInvocationId:
			type = "uint3";
			semantic = "SV_GroupThreadID";
			break;

		case BuiltInLocalInvocationIndex:
			type = "uint";
			semantic = "SV_GroupIndex";
			break;

		case BuiltInWorkgroupId:
			type = "uint3";
			semantic = "SV_GroupID";
			break;

		case BuiltInFrontFacing:
			type = "bool";
			semantic = "SV_IsFrontFace";
			break;

		case BuiltInViewIndex:
			if (hlsl_options.shader_model < 61 || (get_entry_point().model != ExecutionModelVertex && get_entry_point().model != ExecutionModelFragment))
				SPIRV_CROSS_THROW("View Index input is only supported in VS and PS 6.1 or higher.");
			type = "uint";
			semantic = "SV_ViewID";
			break;

		case BuiltInNumWorkgroups:
		case BuiltInSubgroupSize:
		case BuiltInSubgroupLocalInvocationId:
		case BuiltInSubgroupEqMask:
		case BuiltInSubgroupLtMask:
		case BuiltInSubgroupLeMask:
		case BuiltInSubgroupGtMask:
		case BuiltInSubgroupGeMask:
			// Handled specially.
			break;

		case BuiltInBaseVertex:
			if (hlsl_options.shader_model >= 68)
			{
				type = "uint";
				semantic = "SV_StartVertexLocation";
			}
			break;

		case BuiltInBaseInstance:
			if (hlsl_options.shader_model >= 68)
			{
				type = "uint";
				semantic = "SV_StartInstanceLocation";
			}
			break;

		case BuiltInHelperInvocation:
			if (hlsl_options.shader_model < 50 || get_entry_point().model != ExecutionModelFragment)
				SPIRV_CROSS_THROW("Helper Invocation input is only supported in PS 5.0 or higher.");
			break;

		case BuiltInClipDistance:
			// HLSL is a bit weird here, use SV_ClipDistance0, SV_ClipDistance1 and so on with vectors.
			for (uint32_t clip = 0; clip < clip_distance_count; clip += 4)
			{
				uint32_t to_declare = clip_distance_count - clip;
				if (to_declare > 4)
					to_declare = 4;

				uint32_t semantic_index = clip / 4;

				static const char *types[] = { "float", "float2", "float3", "float4" };
				statement(types[to_declare - 1], " ", builtin_to_glsl(builtin, StorageClassInput), semantic_index,
				          " : SV_ClipDistance", semantic_index, ";");
			}
			break;

		case BuiltInCullDistance:
			// HLSL is a bit weird here, use SV_CullDistance0, SV_CullDistance1 and so on with vectors.
			for (uint32_t cull = 0; cull < cull_distance_count; cull += 4)
			{
				uint32_t to_declare = cull_distance_count - cull;
				if (to_declare > 4)
					to_declare = 4;

				uint32_t semantic_index = cull / 4;

				static const char *types[] = { "float", "float2", "float3", "float4" };
				statement(types[to_declare - 1], " ", builtin_to_glsl(builtin, StorageClassInput), semantic_index,
				          " : SV_CullDistance", semantic_index, ";");
			}
			break;

		case BuiltInPointCoord:
			// PointCoord is not supported, but provide a way to just ignore that, similar to PointSize.
			if (hlsl_options.point_coord_compat)
				break;
			else
				SPIRV_CROSS_THROW("Unsupported builtin in HLSL.");

		case BuiltInLayer:
			if (hlsl_options.shader_model < 50 || get_entry_point().model != ExecutionModelFragment)
				SPIRV_CROSS_THROW("Render target array index input is only supported in PS 5.0 or higher.");
			type = "uint";
			semantic = "SV_RenderTargetArrayIndex";
			break;

		default:
			SPIRV_CROSS_THROW("Unsupported builtin in HLSL.");
		}

		if (type && semantic)
			statement(type, " ", builtin_to_glsl(builtin, StorageClassInput), " : ", semantic, ";");
	});
}